

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::PrepareOptTable3(sU8 *Table,sU8 *expand,sInt size)

{
  byte bVar1;
  byte bVar2;
  sInt sVar3;
  sInt sVar4;
  int iVar5;
  sInt err;
  sInt maxe;
  sInt mine;
  sInt max;
  sInt min;
  sInt bestErr;
  sInt i;
  sInt size_local;
  sU8 *expand_local;
  sU8 *Table_local;
  
  for (min = 0; min < 0x100; min = min + 1) {
    max = 0x100;
    for (mine = 0; mine < size; mine = mine + 1) {
      for (maxe = 0; maxe < size; maxe = maxe + 1) {
        bVar1 = expand[mine];
        bVar2 = expand[maxe];
        sVar3 = sAbs(((int)((uint)bVar1 + (uint)bVar2) >> 1) - min);
        sVar4 = sAbs((uint)bVar2 - (uint)bVar1);
        iVar5 = ((sVar4 << 3) >> 8) + sVar3;
        if (iVar5 < max) {
          Table[min << 1] = (sU8)maxe;
          Table[min * 2 + 1] = (sU8)mine;
          max = iVar5;
        }
      }
    }
  }
  return;
}

Assistant:

static void PrepareOptTable3(sU8* Table, const sU8* expand, sInt size) {
  for (sInt i = 0; i < 256; i++) {
    sInt bestErr = 256;

    for (sInt min = 0; min < size; min++) {
      for (sInt max = 0; max < size; max++) {
        sInt mine = expand[min];
        sInt maxe = expand[max];
        sInt err = sAbs(((mine + maxe) >> 1) - i);
        err += ((sAbs(maxe - mine) * 8) >> 8);  // approx. .03f

        if (err < bestErr) {
          Table[i * 2 + 0] = max;
          Table[i * 2 + 1] = min;
          bestErr = err;
        }
      }
    }
  }
}